

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86.cpp
# Opt level: O0

int __thiscall
ncnn::InnerProduct_x86::forward(InnerProduct_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 *in_RCX;
  long *in_RDX;
  undefined8 *in_RSI;
  long *in_RDI;
  bool bVar1;
  size_t out_elemsize;
  int out_elempack;
  int elempack;
  size_t elemsize;
  Option opt_flatten;
  Mat bottom_blob_flattened;
  int elempack_1;
  size_t elemsize_1;
  int h;
  int num_input;
  Mat *in_stack_00000168;
  int in_stack_00000174;
  Mat *in_stack_00000178;
  Mat *in_stack_00000180;
  Mat *in_stack_00000188;
  Mat *in_stack_00000190;
  Mat *in_stack_00000250;
  int in_stack_0000025c;
  Mat *in_stack_00000260;
  Mat *in_stack_00000268;
  Mat *in_stack_00000270;
  Mat *in_stack_00000278;
  Option *in_stack_000020a8;
  Mat *in_stack_000020b0;
  Mat *in_stack_000020b8;
  InnerProduct_x86 *in_stack_000020c0;
  Option *in_stack_000045a0;
  Option *in_stack_0000bd70;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  undefined8 in_stack_fffffffffffffe48;
  int _elempack;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  int in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  Mat *in_stack_fffffffffffffe60;
  Mat *this_00;
  undefined4 local_148;
  undefined4 uStack_144;
  undefined8 uStack_140;
  undefined4 local_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  Mat local_108;
  undefined4 local_bc;
  undefined8 local_b8;
  undefined4 local_b0;
  int local_ac;
  long *local_a0;
  int local_84;
  Mat *local_80;
  int local_60;
  undefined4 local_5c;
  Mat *local_58;
  long *local_50;
  long *local_48;
  Mat *local_38;
  void *local_30;
  long *local_20;
  long *local_18;
  int local_10;
  undefined4 local_c;
  Mat *local_8;
  
  _elempack = (int)((ulong)in_stack_fffffffffffffe48 >> 0x20);
  if (((*(byte *)((long)in_RCX + 0x1e) & 1) == 0) ||
     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 0)) {
    local_ac = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) /
               *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
    local_a0 = in_RDX;
    if ((*(int *)(in_RSI + 5) == 2) && (*(int *)((long)in_RSI + 0x2c) == local_ac)) {
      local_b0 = *(undefined4 *)(in_RSI + 6);
      local_b8 = in_RSI[2];
      local_bc = *(undefined4 *)(in_RSI + 3);
      Mat::create(in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58,
                  CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),_elempack,
                  (Allocator *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
      local_48 = local_a0;
      bVar1 = true;
      if (*local_a0 != 0) {
        local_20 = local_a0;
        bVar1 = local_a0[8] * (long)(int)local_a0[7] == 0;
      }
      if (bVar1) {
        local_84 = -100;
      }
      else {
        innerproduct_gemm_sse
                  (in_stack_00000278,in_stack_00000270,in_stack_00000268,in_stack_00000260,
                   in_stack_0000025c,in_stack_00000250,in_stack_0000bd70);
        local_84 = 0;
      }
    }
    else {
      this_00 = &local_108;
      local_108.data = (void *)*in_RSI;
      local_108.refcount = (int *)in_RSI[1];
      local_108.allocator = (Allocator *)in_RSI[4];
      local_108.dims = *(int *)(in_RSI + 5);
      local_108.w = *(int *)((long)in_RSI + 0x2c);
      local_108.h = *(int *)(in_RSI + 6);
      local_108.d = *(int *)((long)in_RSI + 0x34);
      local_108.c = *(int *)(in_RSI + 7);
      local_108.cstep = in_RSI[8];
      if (local_108.refcount != (int *)0x0) {
        local_c = 1;
        LOCK();
        local_10 = *local_108.refcount;
        *local_108.refcount = *local_108.refcount + 1;
        UNLOCK();
      }
      local_38 = this_00;
      local_8 = this_00;
      if (*(int *)(in_RSI + 5) != 1) {
        local_148 = *in_RCX;
        uStack_144 = in_RCX[1];
        local_138 = in_RCX[4];
        uStack_134 = in_RCX[5];
        uStack_130 = in_RCX[6];
        uStack_12c = in_RCX[7];
        local_128 = in_RCX[8];
        uStack_124 = in_RCX[9];
        uStack_120 = in_RCX[10];
        uStack_11c = in_RCX[0xb];
        local_118 = in_RCX[0xc];
        uStack_114 = in_RCX[0xd];
        uStack_110 = in_RCX[0xe];
        uStack_10c = in_RCX[0xf];
        uStack_140 = *(undefined8 *)(in_RCX + 4);
        (**(code **)(*(long *)in_RDI[1] + 0x38))((long *)in_RDI[1],in_RSI,&local_108,&local_148);
      }
      Mat::create(this_00,in_stack_fffffffffffffe5c,
                  CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),_elempack,
                  (Allocator *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
      local_50 = local_a0;
      bVar1 = true;
      if (*local_a0 != 0) {
        local_18 = local_a0;
        bVar1 = local_a0[8] * (long)(int)local_a0[7] == 0;
      }
      if (bVar1) {
        local_84 = -100;
      }
      else {
        innerproduct_sse(in_stack_00000190,in_stack_00000188,in_stack_00000180,in_stack_00000178,
                         in_stack_00000174,in_stack_00000168,in_stack_000045a0);
        local_84 = 0;
      }
      local_80 = &local_108;
      if (local_108.refcount != (int *)0x0) {
        local_5c = 0xffffffff;
        LOCK();
        local_60 = *local_108.refcount;
        *local_108.refcount = *local_108.refcount + -1;
        UNLOCK();
        if (local_60 == 1) {
          local_58 = local_80;
          if (local_108.allocator == (Allocator *)0x0) {
            local_30 = local_108.data;
            if (local_108.data != (void *)0x0) {
              free(local_108.data);
            }
          }
          else {
            (*(local_108.allocator)->_vptr_Allocator[3])(local_108.allocator,local_108.data);
          }
        }
      }
    }
  }
  else {
    local_84 = forward_int8_x86(in_stack_000020c0,in_stack_000020b8,in_stack_000020b0,
                                in_stack_000020a8);
  }
  return local_84;
}

Assistant:

int InnerProduct_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return forward_fp16s(bottom_blob, top_blob, opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    innerproduct_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

    return 0;
}